

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotBars<unsigned_int>
               (char *label_id,uint *xs,uint *ys,int count,double width,int offset,int stride)

{
  undefined1 local_58 [8];
  GetterXsYs<unsigned_int> getter;
  int stride_local;
  int offset_local;
  double width_local;
  int count_local;
  uint *ys_local;
  uint *xs_local;
  char *label_id_local;
  
  getter.Stride = stride;
  getter._28_4_ = offset;
  GetterXsYs<unsigned_int>::GetterXsYs
            ((GetterXsYs<unsigned_int> *)local_58,xs,ys,count,offset,stride);
  PlotBarsEx<ImPlot::GetterXsYs<unsigned_int>>(label_id,(GetterXsYs<unsigned_int> *)local_58,width);
  return;
}

Assistant:

void PlotBars(const char* label_id, const T* xs, const T* ys, int count, double width, int offset, int stride) {
    GetterXsYs<T> getter(xs,ys,count,offset,stride);
    PlotBarsEx(label_id, getter, width);
}